

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O2

RC __thiscall PF_BufferMgr::MarkDirty(PF_BufferMgr *this,int fd,PageNum pageNum)

{
  RC RVar1;
  int slot;
  
  RVar1 = PF_HashTable::Find(&this->hashTable,fd,pageNum,&slot);
  if (RVar1 == -8) {
    RVar1 = 2;
  }
  else if (RVar1 == 0) {
    if (this->bufTable[slot].pinCount == 0) {
      RVar1 = 7;
    }
    else {
      this->bufTable[slot].bDirty = 1;
      Unlink(this,slot);
      LinkHead(this,slot);
      RVar1 = 0;
    }
  }
  return RVar1;
}

Assistant:

RC PF_BufferMgr::MarkDirty(int fd, PageNum pageNum)
{
   RC  rc;       // return code
   int slot;     // buffer slot where page is located

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Marking dirty (%d,%d).\n", fd, pageNum);
   WriteLog(psMessage);
#endif

   // The page must be found and pinned in the buffer
   if ((rc = hashTable.Find(fd, pageNum, slot))){
      if ((rc == PF_HASHNOTFOUND))
         return (PF_PAGENOTINBUF);
      else
         return (rc);              // unexpected error
   }

   if (bufTable[slot].pinCount == 0)
      return (PF_PAGEUNPINNED);

   // Mark this page dirty
   bufTable[slot].bDirty = TRUE;

   // Make this page the most recently used page
   if ((rc = Unlink(slot)) ||
         (rc = LinkHead (slot)))
      return (rc);

   // Return ok
   return (0);
}